

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopFusion::UsedInContinueOrConditionBlock
          (LoopFusion *this,Instruction *phi_instruction,Loop *loop)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  BasicBlock *this_00;
  DefUseManager *this_01;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = Loop::FindConditionBlock(loop);
  uVar2 = BasicBlock::id(this_00);
  uVar3 = BasicBlock::id(loop->loop_continue_);
  this_01 = IRContext::get_def_use_mgr(this->context_);
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:89:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:89:7)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  local_48._8_4_ = uVar2;
  local_48._12_4_ = uVar3;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    (this_01,phi_instruction,
                     (function<bool_(spvtools::opt::Instruction_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return !bVar1;
}

Assistant:

bool LoopFusion::UsedInContinueOrConditionBlock(Instruction* phi_instruction,
                                                Loop* loop) {
  auto condition_block = loop->FindConditionBlock()->id();
  auto continue_block = loop->GetContinueBlock()->id();
  auto not_used = context_->get_def_use_mgr()->WhileEachUser(
      phi_instruction,
      [this, condition_block, continue_block](Instruction* instruction) {
        auto block_id = context_->get_instr_block(instruction)->id();
        return block_id != condition_block && block_id != continue_block;
      });

  return !not_used;
}